

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt,xmlParserInputBufferPtr buf,xmlCharEncoding enc)

{
  char *encoding_00;
  char *encoding;
  xmlParserInputPtr input;
  xmlCharEncoding enc_local;
  xmlParserInputBufferPtr buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (buf == (xmlParserInputBufferPtr)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)xmlNewInputInternal(buf,(char *)0x0);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      encoding_00 = xmlGetCharEncodingName(enc);
      if (encoding_00 != (char *)0x0) {
        xmlSwitchInputEncodingName(ctxt,(xmlParserInputPtr)ctxt_local,encoding_00);
      }
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewIOInputStream(xmlParserCtxtPtr ctxt, xmlParserInputBufferPtr buf,
	            xmlCharEncoding enc) {
    xmlParserInputPtr input;
    const char *encoding;

    if ((ctxt == NULL) || (buf == NULL))
        return(NULL);

    input = xmlNewInputInternal(buf, NULL);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
	return(NULL);
    }

    encoding = xmlGetCharEncodingName(enc);
    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}